

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool __thiscall
r_exec::PTPX::build_mdl
          (PTPX *this,_Fact *f_icst,_Fact *cause_pattern,_Fact *consequent,
          GuardBuilder *guard_builder,uint64_t period,Code *new_cst)

{
  BindingMap *this_00;
  HLPBindingMap *bm_00;
  Code *pCVar1;
  ModelBase *this_01;
  Code *pCVar2;
  P<r_code::Code> local_78;
  undefined4 local_6c;
  Code *local_68;
  Code *_m0;
  P<r_code::Code> m0;
  uint16_t write_index;
  P<r_exec::BindingMap> local_48;
  P<r_exec::BindingMap> bm;
  uint64_t period_local;
  GuardBuilder *guard_builder_local;
  _Fact *consequent_local;
  _Fact *cause_pattern_local;
  _Fact *f_icst_local;
  PTPX *this_local;
  
  bm.object = (_Object *)period;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  core::P<r_exec::BindingMap>::P(&local_48,this_00);
  bm_00 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_48);
  pCVar1 = _TPX::build_mdl_head
                     (&this->super__TPX,bm_00,0,f_icst,consequent,(uint16_t *)((long)&m0.object + 2)
                     );
  core::P<r_code::Code>::P((P<r_code::Code> *)&_m0,pCVar1);
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  (*(guard_builder->super__Object)._vptr__Object[2])
            (guard_builder,pCVar1,0,cause_pattern,(undefined1 *)((long)&m0.object + 2));
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  _TPX::build_mdl_tail(&this->super__TPX,pCVar1,m0.object._2_2_);
  this_01 = ModelBase::Get();
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  pCVar1 = ModelBase::check_existence(this_01,pCVar1);
  local_68 = pCVar1;
  if (pCVar1 == (Code *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pCVar2 = core::P::operator_cast_to_Code_((P *)&_m0);
    if (pCVar1 == pCVar2) {
      if (new_cst != (Code *)0x0) {
        core::P<r_code::Code>::P(&local_78,new_cst);
        std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                  (&(this->super__TPX).csts,&local_78);
        core::P<r_code::Code>::~P(&local_78);
      }
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                (&(this->super__TPX).mdls,(value_type *)&_m0);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  local_6c = 1;
  core::P<r_code::Code>::~P((P<r_code::Code> *)&_m0);
  core::P<r_exec::BindingMap>::~P(&local_48);
  return this_local._7_1_;
}

Assistant:

bool PTPX::build_mdl(_Fact *f_icst, _Fact *cause_pattern, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period, Code *new_cst)
{
    P<BindingMap> bm = new BindingMap();
    uint16_t write_index;
    P<Code> m0 = build_mdl_head(bm, 0, f_icst, consequent, write_index);
    guard_builder->build(m0, nullptr, cause_pattern, write_index);
    build_mdl_tail(m0, write_index);
    Code *_m0 = ModelBase::Get()->check_existence(m0);

    if (_m0 == nullptr) {
        return false;
    } else if (_m0 == m0) {
        if (new_cst) {
            csts.push_back(new_cst);
        }

        mdls.push_back(m0);
        return true;
    } else { // if m0 already exist, new_cst==NULL.
        return false;
    }
}